

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputs_Full(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  Fts5Index *pFVar1;
  undefined4 uVar2;
  int iVar3;
  int *pRc;
  u8 *a;
  Fts5Colset *pColset;
  Fts5SegIter *pSeg_local;
  Fts5Iter *pIter_local;
  
  a = (u8 *)pIter->pColset;
  (pIter->base).iRowid = pSeg->iRowid;
  pColset = (Fts5Colset *)pSeg;
  pSeg_local = (Fts5SegIter *)pIter;
  if (pSeg->pLeaf->szLeaf < pSeg->iLeafOffset + pSeg->nPos) {
    sqlite3Fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist((Fts5Index *)pSeg_local->pNextLeaf,(Fts5SegIter *)pColset,(Fts5Colset *)a,
                       (Fts5Buffer *)&pSeg_local->iLeafOffset);
    uVar2 = *(undefined4 *)&pSeg_local->field_0x24;
    pSeg_local->flags = pSeg_local->iLeafOffset;
    pSeg_local->iLeafPgno = uVar2;
    *(undefined4 *)&pSeg_local->pLeaf = *(undefined4 *)&pSeg_local->xNext;
  }
  else {
    pRc = (int *)(pSeg->pLeaf->p + pSeg->iLeafOffset);
    if (((Fts5Colset *)a)->nCol == 1) {
      iVar3 = fts5IndexExtractCol((u8 **)&pRc,pSeg->nPos,((Fts5Colset *)a)->aiCol[0]);
      *(int *)&pSeg_local->pLeaf = iVar3;
      *(int **)&pSeg_local->flags = pRc;
    }
    else {
      pFVar1 = pIter->pIndex;
      sqlite3Fts5BufferZero(&pIter->poslist);
      fts5IndexExtractColset
                (&pFVar1->rc,(Fts5Colset *)a,(u8 *)pRc,pColset[0xe].nCol,
                 (Fts5Buffer *)&pSeg_local->iLeafOffset);
      uVar2 = *(undefined4 *)&pSeg_local->field_0x24;
      pSeg_local->flags = pSeg_local->iLeafOffset;
      pSeg_local->iLeafPgno = uVar2;
      *(undefined4 *)&pSeg_local->pLeaf = *(undefined4 *)&pSeg_local->xNext;
    }
  }
  return;
}

Assistant:

static void fts5IterSetOutputs_Full(Fts5Iter *pIter, Fts5SegIter *pSeg){
  Fts5Colset *pColset = pIter->pColset;
  pIter->base.iRowid = pSeg->iRowid;

  assert( pIter->pIndex->pConfig->eDetail==FTS5_DETAIL_FULL );
  assert( pColset );

  if( pSeg->iLeafOffset+pSeg->nPos<=pSeg->pLeaf->szLeaf ){
    /* All data is stored on the current page. Populate the output 
    ** variables to point into the body of the page object. */
    const u8 *a = &pSeg->pLeaf->p[pSeg->iLeafOffset];
    if( pColset->nCol==1 ){
      pIter->base.nData = fts5IndexExtractCol(&a, pSeg->nPos,pColset->aiCol[0]);
      pIter->base.pData = a;
    }else{
      int *pRc = &pIter->pIndex->rc;
      fts5BufferZero(&pIter->poslist);
      fts5IndexExtractColset(pRc, pColset, a, pSeg->nPos, &pIter->poslist);
      pIter->base.pData = pIter->poslist.p;
      pIter->base.nData = pIter->poslist.n;
    }
  }else{
    /* The data is distributed over two or more pages. Copy it into the
    ** Fts5Iter.poslist buffer and then set the output pointer to point
    ** to this buffer.  */
    fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist(pIter->pIndex, pSeg, pColset, &pIter->poslist);
    pIter->base.pData = pIter->poslist.p;
    pIter->base.nData = pIter->poslist.n;
  }
}